

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_decimalquantity.cpp
# Opt level: O0

void __thiscall icu_63::number::impl::DecimalQuantity::clear(DecimalQuantity *this)

{
  DecimalQuantity *this_local;
  
  this->lOptPos = 0x7fffffff;
  this->lReqPos = 0;
  this->rReqPos = 0;
  this->rOptPos = -0x80000000;
  this->flags = '\0';
  setBcdToZero(this);
  return;
}

Assistant:

void DecimalQuantity::clear() {
    lOptPos = INT32_MAX;
    lReqPos = 0;
    rReqPos = 0;
    rOptPos = INT32_MIN;
    flags = 0;
    setBcdToZero(); // sets scale, precision, hasDouble, origDouble, origDelta, and BCD data
}